

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O3

XIM sf::priv::OpenXIM(void)

{
  XIM p_Var1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  Lock lock;
  string prevXLoc;
  string prevLoc;
  Lock local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  char *local_38;
  long local_30;
  char local_28 [16];
  
  Lock::Lock(&local_60,(Mutex *)&(anonymous_namespace)::mutex);
  if ((anonymous_namespace)::referenceCountXIM == 0) {
    pcVar2 = setlocale(6,(char *)0x0);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "";
    }
    local_38 = local_28;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar2,pcVar2 + sVar3);
    pcVar4 = (char *)XSetLocaleModifiers(0);
    pcVar2 = "";
    if (pcVar4 != (char *)0x0) {
      pcVar2 = pcVar4;
    }
    local_58 = local_48;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,pcVar2 + sVar3);
    setlocale(6,"");
    XSetLocaleModifiers("");
    (anonymous_namespace)::sharedXIM = (XIM)XOpenIM((anonymous_namespace)::sharedDisplay,0,0,0);
    if (local_30 != 0) {
      setlocale(6,local_38);
    }
    if (local_50 != 0) {
      XSetLocaleModifiers(local_58);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  p_Var1 = (anonymous_namespace)::sharedXIM;
  (anonymous_namespace)::referenceCountXIM = (anonymous_namespace)::referenceCountXIM + 1;
  Lock::~Lock(&local_60);
  return p_Var1;
}

Assistant:

XIM OpenXIM()
{
    Lock lock(mutex);

    assert(sharedDisplay != NULL);

    if (referenceCountXIM == 0)
    {
        // Create a new XIM instance

        // We need the default (environment) locale and X locale for opening
        // the IM and properly receiving text
        // First save the previous ones (this might be able to be written more elegantly?)
        const char* p;
        std::string prevLoc((p = setlocale(LC_ALL, NULL)) ? p : "");
        std::string prevXLoc((p = XSetLocaleModifiers(NULL)) ? p : "");

        // Set the locales from environment
        setlocale(LC_ALL, "");
        XSetLocaleModifiers("");

        // Create the input context
        sharedXIM = XOpenIM(sharedDisplay, NULL, NULL, NULL);

        // Restore the previous locale
        if (prevLoc.length() != 0)
            setlocale(LC_ALL, prevLoc.c_str());

        if (prevXLoc.length() != 0)
            XSetLocaleModifiers(prevXLoc.c_str());
    }

    referenceCountXIM++;

    return sharedXIM;
}